

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O0

double __thiscall
pobr::imgProcessing::structs::Segment::getHuMomentInvariant(Segment *this,uint8_t *no)

{
  uint8_t *no_local;
  Segment *this_local;
  
  switch(*no) {
  case '\x01':
    this_local = (Segment *)getHuMomentInvariantNo1(this);
    break;
  case '\x02':
    this_local = (Segment *)getHuMomentInvariantNo2(this);
    break;
  case '\x03':
    this_local = (Segment *)getHuMomentInvariantNo3(this);
    break;
  case '\x04':
    this_local = (Segment *)getHuMomentInvariantNo4(this);
    break;
  case '\x05':
    this_local = (Segment *)getHuMomentInvariantNo5(this);
    break;
  case '\x06':
    this_local = (Segment *)getHuMomentInvariantNo6(this);
    break;
  case '\a':
    this_local = (Segment *)getHuMomentInvariantNo7(this);
    break;
  default:
    this_local = (Segment *)0xbff0000000000000;
  }
  return (double)this_local;
}

Assistant:

const double
Segment::getHuMomentInvariant(const uint8_t& no)
const
{
    switch (no) {
    case 1:
        return this->getHuMomentInvariantNo1();
    case 2:
        return this->getHuMomentInvariantNo2();
    case 3:
        return this->getHuMomentInvariantNo3();
    case 4:
        return this->getHuMomentInvariantNo4();
    case 5:
        return this->getHuMomentInvariantNo5();
    case 6:
        return this->getHuMomentInvariantNo6();
    case 7:
        return this->getHuMomentInvariantNo7();
    }

    return -1;
}